

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall slang::ast::Compilation::elaborate(Compilation *this)

{
  pointer *ppcVar1;
  string_view *psVar2;
  undefined4 uVar3;
  pointer ppVar4;
  BindDirectiveSyntax *syntax;
  size_t sVar5;
  InstanceSymbol *pIVar6;
  InstanceBodySymbol *pIVar7;
  pointer ppSVar8;
  InstanceSymbol *pIVar9;
  SourceLocation location;
  pointer ppDVar10;
  pointer ppCVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  ushort uVar14;
  undefined8 uVar15;
  RootSymbol *pRVar16;
  pointer ppIVar17;
  Diagnostic *pDVar18;
  ulong uVar19;
  char_pointer puVar20;
  Symbol *pSVar21;
  char_pointer puVar22;
  string_view *psVar23;
  char_pointer puVar24;
  char_pointer puVar25;
  ulong uVar26;
  pointer ppVar27;
  pointer ppCVar28;
  value_type *elements;
  Compilation *pCVar29;
  Compilation *p;
  Scope *pSVar30;
  Type *pTVar31;
  uint uVar32;
  type *scope;
  Compilation *pCVar33;
  long lVar34;
  pointer p_00;
  table_element_pointer ppVar35;
  table_element_pointer ppVar36;
  char_pointer puVar37;
  char_pointer puVar38;
  uchar uVar39;
  char cVar44;
  char cVar45;
  byte bVar46;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  iterator iVar48;
  iterator iVar49;
  SourceRange SVar50;
  span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> dpiImports;
  span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL> protos;
  span<const_std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_18446744073709551615UL>
  modports;
  string_view arg;
  LookupLocation location_00;
  vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  newUnreferencedDefs;
  DefinitionSymbol *def;
  vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  methods;
  DiagnosticVisitor elabVisitor;
  vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  local_2c8;
  pointer local_2a8;
  pointer local_2a0;
  DefinitionSymbol *local_298;
  undefined1 local_290 [16];
  group_type_pointer local_280;
  undefined1 local_278 [40];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  ResolvedConfig *local_230;
  SourceRange local_228;
  uchar local_218;
  char cStack_217;
  char cStack_216;
  byte bStack_215;
  uchar uStack_214;
  char cStack_213;
  char cStack_212;
  byte bStack_211;
  uchar uStack_210;
  char cStack_20f;
  char cStack_20e;
  byte bStack_20d;
  uchar uStack_20c;
  char cStack_20b;
  char cStack_20a;
  byte bStack_209;
  undefined1 local_200 [20];
  bool local_1ec;
  bool local_1eb;
  bool local_1ea;
  pointer local_1e8;
  pointer local_1e0;
  pointer local_1d8;
  value_type_pointer local_1d0;
  size_ctrl_type local_1c8;
  Segment *local_1b8;
  Segment *local_1b0;
  BumpAllocator *local_1a8;
  Segment *local_1a0;
  allocator_type local_198;
  Type *local_188;
  Type *local_180;
  Type *local_178;
  Type *local_170;
  size_ctrl_type local_168;
  Type *local_158;
  Type *local_150;
  Type *local_148;
  undefined1 local_140 [48];
  Type *local_110;
  Type *local_108;
  undefined1 local_100 [48];
  pointer local_d0;
  pointer local_c8;
  undefined1 local_c0 [96];
  pointer local_60;
  pointer local_58;
  pointer local_50;
  value_type_pointer local_48;
  size_ctrl_type local_40;
  
  local_200._16_4_ = (this->options).errorLimit;
  local_200._16_4_ = -(uint)(local_200._16_4_ == 0) | local_200._16_4_;
  local_200._8_8_ = &this->numErrors;
  local_158 = (Type *)local_140;
  local_1ec = true;
  local_1eb = false;
  local_1ea = false;
  local_1e8 = (pointer)0x3f;
  local_1e0 = (pointer)0x1;
  local_1d0 = (value_type_pointer)0x0;
  local_1d8 = (pointer)boost::unordered::detail::foa::
                       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                       ::storage;
  local_1c8.ml = 0;
  local_1c8.size = 0;
  local_1b8 = (Segment *)0x3f;
  local_1b0 = (Segment *)0x1;
  local_1a0 = (Segment *)0x0;
  local_1a8 = (BumpAllocator *)
              boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
  local_198.alloc = (BumpAllocator *)0x0;
  local_198.freeList = (FreeNode *)0x0;
  local_188 = (Type *)0x3f;
  local_180 = (Type *)0x1;
  local_170 = (Type *)0x0;
  local_178 = (Type *)boost::unordered::detail::foa::
                      dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                      ::storage;
  local_168.ml = 0;
  local_168.size = 0;
  local_150 = (Type *)0x0;
  local_148 = (Type *)0x5;
  local_140._40_8_ = local_100;
  local_110 = (Type *)0x0;
  local_108 = (Type *)0x5;
  local_100._40_8_ = local_c0;
  local_d0 = (pointer)0x0;
  local_c8 = (pointer)0x5;
  local_c0._40_8_ = local_c0 + 0x40;
  local_c0._48_8_ = (Type *)0x0;
  local_c0._56_8_ = (Type *)0x2;
  local_60 = (pointer)0x3f;
  local_58 = (pointer)0x1;
  local_48 = (value_type_pointer)0x0;
  local_50 = (pointer)boost::unordered::detail::foa::
                      dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                      ::storage;
  local_40.ml = 0;
  local_40.size = 0;
  local_200._0_8_ = this;
  pRVar16 = getRoot(this,false);
  Symbol::visit<slang::ast::DiagnosticVisitor&>
            (&pRVar16->super_Symbol,(DiagnosticVisitor *)local_200);
  if (((pointer)(ulong)(uint)local_200._16_4_ < ((_Alloc_hider *)local_200._8_8_)->_M_p) ||
     ((local_1ea & 1U) != 0)) {
    this->sawFatalError = true;
  }
  else {
    pCVar29 = (Compilation *)local_200;
    DiagnosticVisitor::finalize((DiagnosticVisitor *)pCVar29);
    if ((this->dpiExports).
        super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->dpiExports).
        super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish || local_110 != (Type *)0x0) {
      dpiImports._M_extent._M_extent_value = (size_t)local_110;
      dpiImports._M_ptr = (pointer)local_140._40_8_;
      pCVar29 = this;
      checkDPIMethods(this,dpiImports);
    }
    if ((this->externInterfaceMethods).
        super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->externInterfaceMethods).
        super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar29 = (Compilation *)local_290;
      std::
      vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
      ::vector((vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                *)pCVar29,&this->externInterfaceMethods);
      uVar15 = local_290._8_8_;
      p = (Compilation *)local_290._0_8_;
      for (pCVar33 = (Compilation *)local_290._0_8_; local_290._0_8_ = p,
          pCVar33 != (Compilation *)uVar15;
          pCVar33 = (Compilation *)&(pCVar33->super_BumpAllocator).endPtr) {
        pCVar29 = (Compilation *)(pCVar33->super_BumpAllocator).head;
        SubroutineSymbol::connectExternInterfacePrototype((SubroutineSymbol *)pCVar29);
        p = (Compilation *)local_290._0_8_;
      }
      if (p != (Compilation *)0x0) {
        operator_delete(p,(long)local_280 - (long)p);
        pCVar29 = p;
      }
    }
    if (local_d0 != (pointer)0x0) {
      protos._M_extent._M_extent_value = (size_t)local_d0;
      protos._M_ptr = (pointer)local_100._40_8_;
      checkExternIfaceMethods(pCVar29,protos);
    }
    if (local_c0._48_8_ != 0) {
      modports._M_extent._M_extent_value = local_c0._48_8_;
      modports._M_ptr = (pointer)local_c0._40_8_;
      checkModportExports(pCVar29,modports);
    }
    ppVar27 = (this->bindDirectives).
              super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (this->bindDirectives).
             super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar27 != ppVar4) {
      do {
        syntax = ppVar27->first;
        pSVar30 = ppVar27->second;
        local_290._8_8_ = (Compilation *)0x0;
        local_280 = (group_type_pointer)0x5;
        local_230 = (ResolvedConfig *)0x0;
        local_240 = (undefined1  [16])0x0;
        local_250 = (undefined1  [16])0x0;
        local_290._0_8_ = (Compilation *)local_278;
        resolveBindTargets(this,syntax,pSVar30,(ResolvedBind *)local_290);
        checkBindTargetParams(this,syntax,pSVar30,(ResolvedBind *)local_290);
        if ((Compilation *)local_290._0_8_ != (Compilation *)local_278) {
          operator_delete((void *)local_290._0_8_);
        }
        ppVar27 = ppVar27 + 1;
      } while (ppVar27 != ppVar4);
    }
    if ((this->nameConflicts).
        super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->nameConflicts).
        super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::vector
                ((vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *)
                 local_290,&this->nameConflicts);
      uVar15 = local_290._8_8_;
      for (pCVar29 = (Compilation *)local_290._0_8_; pCVar29 != (Compilation *)uVar15;
          pCVar29 = (Compilation *)&(pCVar29->super_BumpAllocator).endPtr) {
        pSVar21 = (Symbol *)(pCVar29->super_BumpAllocator).head;
        Scope::handleNameConflict(pSVar21->parentScope,pSVar21);
      }
      if ((Compilation *)local_290._0_8_ != (Compilation *)0x0) {
        operator_delete((void *)local_290._0_8_,(long)local_280 - local_290._0_8_);
      }
    }
    if ((this->outOfBlockDecls).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
        .size_ctrl.size != 0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
      ::table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                    *)local_290,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                    *)&this->outOfBlockDecls,
                   (allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>
                    *)&local_2c8);
      iVar48 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
               ::begin((table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                        *)local_290);
      if (iVar48.p_ != (table_element_pointer)0x0) {
LAB_003d3e39:
        do {
          ppVar36 = iVar48.p_;
          if ((ppVar36->second).
              super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
              .
              super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
              .super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.super__Tuple_impl<3UL,_bool>.
              super__Head_base<3UL,_bool,_false>._M_head_impl != true) {
            SVar50 = slang::syntax::SyntaxNode::sourceRange
                               ((SyntaxNode *)
                                (((ppVar36->second).
                                  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                  .
                                  super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                  .
                                  super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>
                                 ._M_head_impl)->left).ptr);
            pSVar30 = (ppVar36->first).
                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                      .
                      super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                      .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                      super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
            location_00.index =
                 (ppVar36->second).
                 super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                 .
                 super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                 .super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.
                 super__Head_base<2UL,_slang::ast::SymbolIndex,_false>._M_head_impl;
            location_00.scope = pSVar30;
            location_00._12_4_ = 0;
            local_228 = SVar50;
            pSVar21 = Lookup::unqualifiedAt
                                (pSVar30,(ppVar36->first).
                                         super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                         .
                                         super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                         ._M_head_impl,location_00,SVar50,
                                 (bitmask<slang::ast::LookupFlags>)0x0);
            if (((pSVar21 != (Symbol *)0x0) &&
                ((ppVar36->first).
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 .
                 super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 .
                 super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                 ._M_head_impl._M_len != 0)) &&
               ((ppVar36->first).
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                ._M_head_impl._M_len != 0)) {
              if ((pSVar21->kind == GenericClassDef) || (pSVar21->kind == ClassType)) {
                pSVar30 = (ppVar36->first).
                          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                          .
                          super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                          .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                          super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
                SVar50 = slang::syntax::SyntaxNode::sourceRange
                                   ((SyntaxNode *)
                                    (ppVar36->second).
                                    super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                    .
                                    super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                    .
                                    super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>
                                    ._M_head_impl);
                pDVar18 = Scope::addDiag(pSVar30,(DiagCode)0x1c000d,SVar50);
                pDVar18 = Diagnostic::operator<<
                                    (pDVar18,(ppVar36->first).
                                             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                             .
                                             super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                             .
                                             super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                             ._M_head_impl);
                Diagnostic::operator<<
                          (pDVar18,(ppVar36->first).
                                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                   .
                                   super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                   ._M_head_impl);
              }
              else {
                pDVar18 = Scope::addDiag((ppVar36->first).
                                         super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                         .
                                         super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                         .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                                         super__Head_base<2UL,_const_slang::ast::Scope_*,_false>.
                                         _M_head_impl,(DiagCode)0x1e000a,SVar50);
                Diagnostic::operator<<
                          (pDVar18,(ppVar36->first).
                                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                   .
                                   super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                   ._M_head_impl);
              }
            }
          }
          puVar25 = iVar48.pc_ + 0x12;
          puVar38 = iVar48.pc_ + 2;
LAB_003d3f1d:
          puVar22 = puVar38;
          puVar38 = iVar48.pc_;
          ppVar36 = iVar48.p_ + 1;
          if (((uint)iVar48.pc_ & 0xf) != 0xe) goto code_r0x003d3f2c;
          auVar42[0] = -(*puVar22 == '\0');
          auVar42[1] = -(puVar22[1] == '\0');
          auVar42[2] = -(puVar22[2] == '\0');
          auVar42[3] = -(puVar22[3] == '\0');
          auVar42[4] = -(puVar22[4] == '\0');
          auVar42[5] = -(puVar22[5] == '\0');
          auVar42[6] = -(puVar22[6] == '\0');
          auVar42[7] = -(puVar22[7] == '\0');
          auVar42[8] = -(puVar22[8] == '\0');
          auVar42[9] = -(puVar22[9] == '\0');
          auVar42[10] = -(puVar22[10] == '\0');
          auVar42[0xb] = -(puVar22[0xb] == '\0');
          auVar42[0xc] = -(puVar22[0xc] == '\0');
          auVar42[0xd] = -(puVar22[0xd] == '\0');
          auVar42[0xe] = -(puVar22[0xe] == '\0');
          auVar42[0xf] = -(puVar22[0xf] == '\0');
          uVar14 = (ushort)(SUB161(auVar42 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe;
          while (uVar14 == 0x7fff) {
            ppVar36 = ppVar36 + 0xf;
            auVar43[0] = -(*puVar25 == '\0');
            auVar43[1] = -(puVar25[1] == '\0');
            auVar43[2] = -(puVar25[2] == '\0');
            auVar43[3] = -(puVar25[3] == '\0');
            auVar43[4] = -(puVar25[4] == '\0');
            auVar43[5] = -(puVar25[5] == '\0');
            auVar43[6] = -(puVar25[6] == '\0');
            auVar43[7] = -(puVar25[7] == '\0');
            auVar43[8] = -(puVar25[8] == '\0');
            auVar43[9] = -(puVar25[9] == '\0');
            auVar43[10] = -(puVar25[10] == '\0');
            auVar43[0xb] = -(puVar25[0xb] == '\0');
            auVar43[0xc] = -(puVar25[0xc] == '\0');
            auVar43[0xd] = -(puVar25[0xd] == '\0');
            auVar43[0xe] = -(puVar25[0xe] == '\0');
            auVar43[0xf] = -(puVar25[0xf] == '\0');
            puVar22 = puVar25;
            puVar25 = puVar25 + 0x10;
            uVar14 = (ushort)(SUB161(auVar43 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe;
          }
          uVar32 = 0;
          if ((uVar14 ^ 0x7fff) != 0) {
            for (; ((uVar14 ^ 0x7fff) >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
            }
          }
          if (puVar22[uVar32] == '\x01') break;
          iVar48.p_ = (table_element_pointer)
                      ((long)&(ppVar36->first).
                              super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                              .
                              super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                              .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                              super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
                      (ulong)(uVar32 << 6));
          iVar48.pc_ = puVar22 + uVar32;
        } while( true );
      }
LAB_003d3d34:
      elaborate((Compilation *)local_290);
    }
    if (((this->configBlocks).table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
         .size_ctrl.size != 0) &&
       (iVar49 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                 ::begin(&(this->configBlocks).table_), iVar49.p_ != (table_element_pointer)0x0)) {
LAB_003d3d6d:
      do {
        ppCVar11 = ((iVar49.p_)->second).
                   super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar28 = ((iVar49.p_)->second).
                        super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppCVar28 != ppCVar11;
            ppCVar28 = ppCVar28 + 1) {
          if ((*ppCVar28)->isUsed == true) {
            ConfigBlockSymbol::checkUnusedRules(*ppCVar28);
          }
        }
        puVar24 = iVar49.pc_ + 0x12;
        puVar37 = iVar49.pc_ + 2;
LAB_003d3d99:
        puVar20 = puVar37;
        puVar37 = iVar49.pc_;
        ppVar35 = iVar49.p_ + 1;
        if (((uint)iVar49.pc_ & 0xf) != 0xe) goto code_r0x003d3da8;
        auVar40[0] = -(*puVar20 == '\0');
        auVar40[1] = -(puVar20[1] == '\0');
        auVar40[2] = -(puVar20[2] == '\0');
        auVar40[3] = -(puVar20[3] == '\0');
        auVar40[4] = -(puVar20[4] == '\0');
        auVar40[5] = -(puVar20[5] == '\0');
        auVar40[6] = -(puVar20[6] == '\0');
        auVar40[7] = -(puVar20[7] == '\0');
        auVar40[8] = -(puVar20[8] == '\0');
        auVar40[9] = -(puVar20[9] == '\0');
        auVar40[10] = -(puVar20[10] == '\0');
        auVar40[0xb] = -(puVar20[0xb] == '\0');
        auVar40[0xc] = -(puVar20[0xc] == '\0');
        auVar40[0xd] = -(puVar20[0xd] == '\0');
        auVar40[0xe] = -(puVar20[0xe] == '\0');
        auVar40[0xf] = -(puVar20[0xf] == '\0');
        uVar14 = (ushort)(SUB161(auVar40 >> 7,0) & 1) | (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe;
        while (uVar14 == 0x7fff) {
          ppVar35 = ppVar35 + 0xf;
          auVar41[0] = -(*puVar24 == '\0');
          auVar41[1] = -(puVar24[1] == '\0');
          auVar41[2] = -(puVar24[2] == '\0');
          auVar41[3] = -(puVar24[3] == '\0');
          auVar41[4] = -(puVar24[4] == '\0');
          auVar41[5] = -(puVar24[5] == '\0');
          auVar41[6] = -(puVar24[6] == '\0');
          auVar41[7] = -(puVar24[7] == '\0');
          auVar41[8] = -(puVar24[8] == '\0');
          auVar41[9] = -(puVar24[9] == '\0');
          auVar41[10] = -(puVar24[10] == '\0');
          auVar41[0xb] = -(puVar24[0xb] == '\0');
          auVar41[0xc] = -(puVar24[0xc] == '\0');
          auVar41[0xd] = -(puVar24[0xd] == '\0');
          auVar41[0xe] = -(puVar24[0xe] == '\0');
          auVar41[0xf] = -(puVar24[0xf] == '\0');
          puVar20 = puVar24;
          puVar24 = puVar24 + 0x10;
          uVar14 = (ushort)(SUB161(auVar41 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe;
        }
        uVar32 = 0;
        if ((uVar14 ^ 0x7fff) != 0) {
          for (; ((uVar14 ^ 0x7fff) >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
          }
        }
        if (puVar20[uVar32] == '\x01') break;
        iVar49.p_ = ppVar35 + uVar32;
        iVar49.pc_ = puVar20 + uVar32;
      } while( true );
    }
LAB_003d39e8:
    if (((this->options).flags.m_bits & 0x10) == 0) {
      pRVar16 = getRoot(this,false);
      sVar5 = (pRVar16->topInstances)._M_extent._M_extent_value;
      if (sVar5 != 0) {
        ppIVar17 = (pRVar16->topInstances)._M_ptr;
        local_2a8 = ppIVar17 + sVar5;
        do {
          pIVar6 = *ppIVar17;
          pIVar7 = pIVar6->body;
          local_2a0 = ppIVar17;
          if ((pIVar7->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&pIVar7->super_Scope);
          }
          sVar5 = (pIVar7->portList)._M_extent._M_extent_value;
          if (sVar5 != 0) {
            ppSVar8 = (pIVar7->portList)._M_ptr;
            psVar2 = &(pIVar6->super_InstanceSymbolBase).super_Symbol.name;
            lVar34 = 0;
            do {
              pIVar9 = *(InstanceSymbol **)((long)ppSVar8 + lVar34);
              if ((pIVar9->super_InstanceSymbolBase).super_Symbol.kind == InterfacePort) {
                pDVar18 = Scope::addDiag(&pIVar6->body->super_Scope,(DiagCode)0x1d000d,
                                         (pIVar9->super_InstanceSymbolBase).super_Symbol.location);
                pDVar18 = Diagnostic::operator<<(pDVar18,*psVar2);
                Diagnostic::operator<<(pDVar18,(pIVar9->super_InstanceSymbolBase).super_Symbol.name)
                ;
                break;
              }
              if (*(int *)&pIVar9->body == 3) {
                pSVar30 = &pIVar6->body->super_Scope;
                location = (pIVar9->super_InstanceSymbolBase).super_Symbol.location;
                if ((pIVar9->super_InstanceSymbolBase).super_Symbol.name._M_len == 0) {
                  pDVar18 = Scope::addDiag(pSVar30,(DiagCode)0x1f000d,location);
                  psVar23 = psVar2;
                  pIVar9 = pIVar6;
                }
                else {
                  pDVar18 = Scope::addDiag(pSVar30,(DiagCode)0x1e000d,location);
                  pDVar18 = Diagnostic::operator<<(pDVar18,*psVar2);
                  psVar23 = &(pIVar9->super_InstanceSymbolBase).super_Symbol.name;
                }
                arg._M_str = (pIVar9->super_InstanceSymbolBase).super_Symbol.name._M_str;
                arg._M_len = psVar23->_M_len;
                Diagnostic::operator<<(pDVar18,arg);
              }
              lVar34 = lVar34 + 8;
            } while (sVar5 << 3 != lVar34);
          }
          ppIVar17 = local_2a0 + 1;
        } while (ppIVar17 != local_2a8);
      }
    }
    local_2c8.
    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.
    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.
    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::reserve(&local_2c8,
              (long)(this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    p_00 = (this->unreferencedDefs).
           super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
    ppDVar10 = (this->unreferencedDefs).
               super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (p_00 != ppDVar10) {
      do {
        local_298 = *p_00;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_298;
        uVar26 = SUB168(auVar13 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar13 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar19 = uVar26 >> ((byte)local_188 & 0x3f);
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar26 & 0xff];
        pTVar31 = (Type *)0x0;
        do {
          ppcVar1 = (pointer *)((long)&(local_178->super_Symbol).kind + uVar19 * 2 * 8);
          local_218 = *(uchar *)ppcVar1;
          cStack_217 = *(char *)((long)ppcVar1 + 1);
          cStack_216 = *(char *)((long)ppcVar1 + 2);
          bStack_215 = *(char *)((long)ppcVar1 + 3);
          uStack_214 = *(char *)((long)ppcVar1 + 4);
          cStack_213 = *(char *)((long)ppcVar1 + 5);
          cStack_212 = *(char *)((long)ppcVar1 + 6);
          bStack_211 = *(char *)((long)ppcVar1 + 7);
          uStack_210 = *(uchar *)(ppcVar1 + 1);
          cStack_20f = *(char *)((long)(ppcVar1 + 1) + 1);
          cStack_20e = *(char *)((long)(ppcVar1 + 1) + 2);
          bStack_20d = *(char *)((long)(ppcVar1 + 1) + 3);
          uStack_20c = *(char *)((long)(ppcVar1 + 1) + 4);
          cStack_20b = *(char *)((long)(ppcVar1 + 1) + 5);
          cStack_20a = *(char *)((long)(ppcVar1 + 1) + 6);
          bStack_209 = *(char *)((long)(ppcVar1 + 1) + 7);
          uVar39 = (uchar)uVar3;
          auVar47[0] = -(local_218 == uVar39);
          cVar44 = (char)((uint)uVar3 >> 8);
          auVar47[1] = -(cStack_217 == cVar44);
          cVar45 = (char)((uint)uVar3 >> 0x10);
          auVar47[2] = -(cStack_216 == cVar45);
          bVar46 = (byte)((uint)uVar3 >> 0x18);
          auVar47[3] = -(bStack_215 == bVar46);
          auVar47[4] = -(uStack_214 == uVar39);
          auVar47[5] = -(cStack_213 == cVar44);
          auVar47[6] = -(cStack_212 == cVar45);
          auVar47[7] = -(bStack_211 == bVar46);
          auVar47[8] = -(uStack_210 == uVar39);
          auVar47[9] = -(cStack_20f == cVar44);
          auVar47[10] = -(cStack_20e == cVar45);
          auVar47[0xb] = -(bStack_20d == bVar46);
          auVar47[0xc] = -(uStack_20c == uVar39);
          auVar47[0xd] = -(cStack_20b == cVar44);
          auVar47[0xe] = -(cStack_20a == cVar45);
          auVar47[0xf] = -(bStack_209 == bVar46);
          uVar32 = (uint)(ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe);
          if (uVar32 != 0) {
            do {
              uVar12 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              if (local_298 ==
                  *(DefinitionSymbol **)((long)local_170 + (ulong)uVar12 * 8 + uVar19 * 0x78))
              goto LAB_003d3c6e;
              uVar32 = uVar32 - 1 & uVar32;
            } while (uVar32 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar26 & 7] & bStack_209) == 0)
          break;
          pSVar21 = &pTVar31->super_Symbol;
          pTVar31 = (Type *)((long)&(pTVar31->super_Symbol).kind + 1);
          uVar19 = (long)&pSVar21->kind + uVar19 + 1 & (ulong)local_180;
        } while (pTVar31 <= local_180);
        if (local_2c8.
            super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_2c8.
            super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
          ::_M_realloc_insert<slang::ast::DefinitionSymbol_const*const&>
                    ((vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                      *)&local_2c8,
                     (iterator)
                     local_2c8.
                     super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_298);
        }
        else {
          *local_2c8.
           super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = local_298;
          local_2c8.
          super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_2c8.
               super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
LAB_003d3c6e:
        p_00 = p_00 + 1;
      } while (p_00 != ppDVar10);
      p_00 = (this->unreferencedDefs).
             super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    }
    ppDVar10 = (this->unreferencedDefs).
               super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->unreferencedDefs).
    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_2c8.
         super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->unreferencedDefs).
    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_2c8.
         super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->unreferencedDefs).
    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2c8.
         super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2c8.
    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.
    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.
    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (p_00 != (pointer)0x0) {
      operator_delete(p_00,(long)ppDVar10 - (long)p_00);
      if (local_2c8.
          super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c8.
                        super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2c8.
                              super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.
                              super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  DiagnosticVisitor::~DiagnosticVisitor((DiagnosticVisitor *)local_200);
  return;
code_r0x003d3f2c:
  iVar48.p_ = ppVar36;
  iVar48.pc_ = puVar38 + 1;
  puVar25 = puVar25 + 1;
  puVar38 = puVar22 + 1;
  if (puVar22[-1] != '\0') goto code_r0x003d3f3d;
  goto LAB_003d3f1d;
code_r0x003d3f3d:
  if (puVar22[-1] == '\x01') goto LAB_003d3d34;
  iVar48.pc_ = puVar22 + -1;
  goto LAB_003d3e39;
code_r0x003d3da8:
  iVar49.p_ = ppVar35;
  iVar49.pc_ = puVar37 + 1;
  puVar24 = puVar24 + 1;
  puVar37 = puVar20 + 1;
  if (puVar20[-1] != '\0') goto code_r0x003d3db9;
  goto LAB_003d3d99;
code_r0x003d3db9:
  if (puVar20[-1] == '\x01') goto LAB_003d39e8;
  iVar49.pc_ = puVar20 + -1;
  goto LAB_003d3d6d;
}

Assistant:

void Compilation::elaborate() {
    SLANG_ASSERT(!isFrozen());

    // Touch every symbol, scope, statement, and expression tree so that
    // we can be sure we have all the diagnostics.
    uint32_t errorLimit = options.errorLimit == 0 ? UINT32_MAX : options.errorLimit;
    DiagnosticVisitor elabVisitor(*this, numErrors, errorLimit);
    getRoot().visit(elabVisitor);

    if (elabVisitor.finishedEarly()) {
        sawFatalError = true;
        return;
    }

    elabVisitor.finalize();

    // Note for the following checks here: anything that depends on a list
    // stored in the compilation object should think carefully about taking
    // a copy of that list first before iterating over it, because your check
    // might trigger additional action that ends up adding to that list,
    // causing undefined behavior.

    // Check all DPI methods for correctness.
    if (!dpiExports.empty() || !elabVisitor.dpiImports.empty())
        checkDPIMethods(elabVisitor.dpiImports);

    // Check extern interface methods for correctness.
    if (!externInterfaceMethods.empty()) {
        auto methods = externInterfaceMethods;
        for (auto method : methods)
            method->connectExternInterfacePrototype();
    }

    if (!elabVisitor.externIfaceProtos.empty())
        checkExternIfaceMethods(elabVisitor.externIfaceProtos);

    if (!elabVisitor.modportsWithExports.empty())
        checkModportExports(elabVisitor.modportsWithExports);

    // Double check any bind directives for correctness. These were already
    // resolved prior to full elaboration but their diagnostics were not
    // issued so we need to check again.
    for (auto [directive, scope] : bindDirectives) {
        ResolvedBind resolvedBind;
        resolveBindTargets(*directive, *scope, resolvedBind);
        checkBindTargetParams(*directive, *scope, resolvedBind);
    }

    // Report any lingering name conflicts.
    if (!nameConflicts.empty()) {
        auto conflicts = nameConflicts;
        for (auto symbol : conflicts) {
            auto scope = symbol->getParentScope();
            SLANG_ASSERT(scope);
            scope->handleNameConflict(*symbol);
        }
    }

    // Report on unused out-of-block definitions. These are always a real error.
    if (!outOfBlockDecls.empty()) {
        auto decls = outOfBlockDecls;
        for (auto& [key, val] : decls) {
            auto& [syntax, name, index, used] = val;
            if (!used) {
                auto& [className, declName, scope] = key;
                auto classRange = name->left->sourceRange();
                auto sym = Lookup::unqualifiedAt(*scope, className,
                                                 LookupLocation(scope, uint32_t(index)),
                                                 classRange);

                if (sym && !declName.empty() && !className.empty()) {
                    if (sym->kind == SymbolKind::ClassType ||
                        sym->kind == SymbolKind::GenericClassDef) {
                        auto& diag = scope->addDiag(diag::NoDeclInClass, name->sourceRange());
                        diag << declName << className;
                    }
                    else {
                        auto& diag = scope->addDiag(diag::NotAClass, classRange);
                        diag << className;
                    }
                }
            }
        }
    }

    // Report on unused config rules.
    if (!configBlocks.empty()) {
        for (auto& [name, confList] : configBlocks) {
            for (auto config : confList) {
                if (config->isUsed)
                    config->checkUnusedRules();
            }
        }
    }

    if (!hasFlag(CompilationFlags::AllowTopLevelIfacePorts)) {
        // Top level instances cannot have interface or ref ports.
        for (auto inst : getRoot().topInstances) {
            for (auto port : inst->body.getPortList()) {
                if (port->kind == SymbolKind::InterfacePort) {
                    inst->body.addDiag(diag::TopModuleIfacePort, port->location)
                        << inst->name << port->name;
                    break;
                }
                else {
                    ArgumentDirection dir;
                    if (port->kind == SymbolKind::MultiPort)
                        dir = port->as<MultiPortSymbol>().direction;
                    else
                        dir = port->as<PortSymbol>().direction;

                    if (dir == ArgumentDirection::Ref) {
                        if (port->name.empty()) {
                            inst->body.addDiag(diag::TopModuleUnnamedRefPort, port->location)
                                << inst->name;
                        }
                        else {
                            inst->body.addDiag(diag::TopModuleRefPort, port->location)
                                << inst->name << port->name;
                        }
                    }
                }
            }
        }
    }

    // Remove definitions from the "unused" set if they were referenced
    // in an interface port somewhere.
    std::vector<const DefinitionSymbol*> newUnreferencedDefs;
    newUnreferencedDefs.reserve(unreferencedDefs.size());
    for (auto def : unreferencedDefs) {
        if (elabVisitor.usedIfacePorts.find(def) == elabVisitor.usedIfacePorts.end())
            newUnreferencedDefs.push_back(def);
    }
    unreferencedDefs = std::move(newUnreferencedDefs);
}